

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O0

void __thiscall re2::SparseSet::SparseSet(SparseSet *this,int max_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  int *piVar5;
  int local_18;
  int i;
  int max_size_local;
  SparseSet *this_local;
  
  this->max_size_ = max_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)max_size;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar4);
  this->sparse_to_dense_ = piVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)max_size;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar4);
  this->dense_ = piVar5;
  bVar3 = InitMemory();
  if (bVar3) {
    for (local_18 = 0; local_18 < max_size; local_18 = local_18 + 1) {
      this->dense_[local_18] = -0x54545455;
      this->sparse_to_dense_[local_18] = -0x54545455;
    }
  }
  this->size_ = 0;
  return;
}

Assistant:

SparseSet(int max_size) {
    max_size_ = max_size;
    sparse_to_dense_ = new int[max_size];
    dense_ = new int[max_size];
    // Don't need to zero the memory, but do so anyway
    // to appease Valgrind.
    if (InitMemory()) {
      for (int i = 0; i < max_size; i++) {
        dense_[i] = 0xababababU;
        sparse_to_dense_[i] = 0xababababU;
      }
    }
    size_ = 0;
  }